

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::FlareState::Encode(FlareState *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  FlareState *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32TSC);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Src).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32NumInt);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32NumSrcs);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16GeometryIndex);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  return;
}

Assistant:

void FlareState::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << m_ui32TSC
           << KDIS_STREAM m_Src
           << m_ui32NumInt
           << m_ui32NumSrcs
           << m_ui16GeometryIndex
           << m_ui16Padding;
}